

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O2

bool duckdb::FSSTStorage::StringAnalyze(AnalyzeState *state_p,Vector *input,idx_t count)

{
  bool bVar1;
  idx_t iVar2;
  ulong uVar3;
  AnalyzeState *pAVar4;
  ulong uVar5;
  value_type *data;
  idx_t i;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  anon_union_16_2_67f50693_for_value local_88;
  UnifiedVectorFormat vdata;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
  Vector::ToUnifiedFormat(input,count,&vdata);
  state_p[1].info.block_manager =
       (BlockManager *)((long)&(state_p[1].info.block_manager)->_vptr_BlockManager + count);
  if (*(char *)&state_p[0xb].info.block_manager == '\x01') {
    dVar8 = RandomEngine::NextRandom((RandomEngine *)&state_p[8].info);
    bVar1 = 0.25 <= dVar8;
  }
  else {
    bVar1 = false;
  }
  for (uVar6 = 0; count != uVar6; uVar6 = uVar6 + 1) {
    uVar5 = uVar6;
    if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
      uVar5 = (ulong)(vdata.sel)->sel_vector[uVar6];
    }
    if ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar5 >> 6] >>
         (uVar5 & 0x3f) & 1) != 0)) {
      uVar7 = (ulong)*(uint *)(vdata.data + uVar5 * 0x10);
      iVar2 = CompressionInfo::GetBlockSize(&state_p->info);
      uVar3 = iVar2 >> 2 & 0xfffffffffffffff8;
      if (0xfff < uVar3) {
        uVar3 = 0x1000;
      }
      if (uVar7 < uVar3 && !bVar1) {
        pAVar4 = state_p + 0xc;
        uVar3 = 1;
        if (uVar7 != 0) {
          data = (value_type *)(vdata.data + uVar5 * 0x10);
          *(undefined1 *)&state_p[0xb].info.block_manager = 1;
          pAVar4 = state_p + 8;
          uVar3 = uVar7;
          if ((data->value).pointer.length < 0xd) {
            ::std::vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>::push_back
                      ((vector<duckdb::string_t,_std::allocator<duckdb::string_t>_> *)
                       &state_p[6].info,data);
          }
          else {
            local_88.pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)
                 StringHeap::AddBlob((StringHeap *)(state_p + 2),data);
            ::std::vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>::
            emplace_back<duckdb::string_t>
                      ((vector<duckdb::string_t,_std::allocator<duckdb::string_t>_> *)
                       &state_p[6].info,(string_t *)&local_88.pointer);
          }
        }
        pAVar4->_vptr_AnalyzeState = (_func_int **)((long)pAVar4->_vptr_AnalyzeState + uVar3);
      }
      else if (uVar3 <= uVar7) break;
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
  return count <= uVar6;
}

Assistant:

bool FSSTStorage::StringAnalyze(AnalyzeState &state_p, Vector &input, idx_t count) {
	auto &state = state_p.Cast<FSSTAnalyzeState>();
	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);

	state.count += count;
	auto data = UnifiedVectorFormat::GetData<string_t>(vdata);

	// Note that we ignore the sampling in case we have not found any valid strings yet, this solves the issue of
	// not having seen any valid strings here leading to an empty fsst symbol table.
	bool sample_selected = !state.have_valid_row || state.random_engine.NextRandom() < ANALYSIS_SAMPLE_SIZE;

	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);

		if (!vdata.validity.RowIsValid(idx)) {
			continue;
		}

		// We need to check all strings for this, otherwise we run in to trouble during compression if we miss ones
		auto string_size = data[idx].GetSize();
		if (string_size >= StringUncompressed::GetStringBlockLimit(state.info.GetBlockSize())) {
			return false;
		}

		if (!sample_selected) {
			continue;
		}

		if (string_size > 0) {
			state.have_valid_row = true;
			if (data[idx].IsInlined()) {
				state.fsst_strings.push_back(data[idx]);
			} else {
				state.fsst_strings.emplace_back(state.fsst_string_heap.AddBlob(data[idx]));
			}
			state.fsst_string_total_size += string_size;
		} else {
			state.empty_strings++;
		}
	}
	return true;
}